

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

string * cmQtAutoGen::GeneratorName_abi_cxx11_(GenT genType)

{
  string *psStack_10;
  GenT genType_local;
  
  switch(genType) {
  case GEN:
    psStack_10 = &GenAutoGen_abi_cxx11_;
    break;
  case MOC:
    psStack_10 = &GenAutoMoc_abi_cxx11_;
    break;
  case UIC:
    psStack_10 = &GenAutoUic_abi_cxx11_;
    break;
  case RCC:
    psStack_10 = &GenAutoRcc_abi_cxx11_;
    break;
  default:
    psStack_10 = &GenAutoGen_abi_cxx11_;
  }
  return psStack_10;
}

Assistant:

std::string const& cmQtAutoGen::GeneratorName(GenT genType)
{
  switch (genType) {
    case GenT::GEN:
      return GenAutoGen;
    case GenT::MOC:
      return GenAutoMoc;
    case GenT::UIC:
      return GenAutoUic;
    case GenT::RCC:
      return GenAutoRcc;
  }
  return GenAutoGen;
}